

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

float Cipher::findBestCutoffFreq
                (TWaveformF *waveform,EAudioFilter filterId,int64_t sampleRate,
                float minCutoffFreq_Hz,float maxCutoffFreq_Hz,float step_Hz)

{
  bool bVar1;
  reference pvVar2;
  TWaveformViewT<short> *in_RDX;
  float in_XMM0_Da;
  double dVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  stWaveformView<short> sVar4;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> clusteringsCur;
  TParameters params;
  Processor processor;
  TFreqMap freqMap;
  TSimilarityMap similarityMap;
  TWaveformI16 waveformThreshold;
  TWaveformI16 waveformMax;
  TKeyPressCollectionI16 keyPresses;
  TWaveformF waveformFiltered;
  TWaveformI16 waveformInput;
  float freqCutoff_Hz;
  float freqCutoffBest_Hz;
  double pClustersBest;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  Processor *in_stack_fffffffffffffd20;
  EVP_PKEY_CTX *in_stack_fffffffffffffd30;
  int64_t in_stack_fffffffffffffd48;
  short *in_stack_fffffffffffffd50;
  pointer in_stack_fffffffffffffd68;
  pointer in_stack_fffffffffffffd70;
  EVP_PKEY_CTX local_288 [4];
  undefined4 local_284;
  undefined4 local_268;
  int64_t in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc8;
  EAudioFilter in_stack_fffffffffffffdcc;
  TWaveformT<float> *in_stack_fffffffffffffdd0;
  TFreqMap *in_stack_fffffffffffffdf8;
  TKeyPressCollectionT<short> *in_stack_fffffffffffffe00;
  int32_t in_stack_fffffffffffffe0c;
  int32_t in_stack_fffffffffffffe10;
  int32_t in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe74;
  Processor *in_stack_fffffffffffffe78;
  undefined1 in_stack_ffffffffffffffb7;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  float fVar5;
  TWaveformT<short> *waveformMax_00;
  undefined4 in_stack_ffffffffffffffd0;
  float fVar6;
  float local_4;
  
  sVar4.n = in_stack_fffffffffffffd48;
  sVar4.samples = in_stack_fffffffffffffd50;
  waveformMax_00 = (TWaveformT<short> *)0xc202a05f20000000;
  fVar5 = in_XMM0_Da;
  fVar6 = in_XMM0_Da;
  while( true ) {
    if (in_XMM1_Da < in_XMM0_Da) {
      return fVar5;
    }
    std::vector<short,_std::allocator<short>_>::vector
              ((vector<short,_std::allocator<short>_> *)0x1bc016);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd70,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd68);
    filter<float>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                  in_stack_fffffffffffffdc0);
    bVar1 = convert<float,short>((TWaveformT<float> *)sVar4.samples,(TWaveformT<short> *)sVar4.n);
    if (bVar1) {
      stKeyPressCollection<short>::stKeyPressCollection
                ((stKeyPressCollection<short> *)in_stack_fffffffffffffd20);
      std::vector<short,_std::allocator<short>_>::vector
                ((vector<short,_std::allocator<short>_> *)0x1bc10f);
      std::vector<short,_std::allocator<short>_>::vector
                ((vector<short,_std::allocator<short>_> *)0x1bc11c);
      sVar4 = getView<short>((TWaveformT<short> *)in_stack_fffffffffffffd20,
                             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      in_stack_fffffffffffffd18 = 1;
      bVar1 = findKeyPresses<short>
                        (in_RDX,(TKeyPressCollectionT<short> *)CONCAT44(fVar6,in_XMM1_Da),
                         (TWaveformT<short> *)CONCAT44(in_XMM2_Da,in_stack_ffffffffffffffd0),
                         waveformMax_00,(double)CONCAT44(fVar5,in_XMM0_Da),in_stack_ffffffffffffffbc
                         ,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
      if (!bVar1) {
        fprintf(_stderr,"%s:%d: findKeyPresses() failed\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                ,0x520);
        local_4 = fVar6;
      }
      bVar1 = !bVar1;
      std::vector<short,_std::allocator<short>_>::~vector
                ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffd30);
      std::vector<short,_std::allocator<short>_>::~vector
                ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffd30);
      if (!bVar1) {
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::vector((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                  *)0x1bc267);
        bVar1 = calculateSimilartyMap<short>
                          (in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe0c,in_stack_fffffffffffffe00,
                           (TSimilarityMap *)in_stack_fffffffffffffdf8);
        if (bVar1) {
          TFreqMap::TFreqMap((TFreqMap *)0x1bc308);
          Processor::Processor(in_stack_fffffffffffffd20);
          in_stack_fffffffffffffd30 = local_288;
          TParameters::TParameters(&in_stack_fffffffffffffd20->m_params);
          local_284 = 0x32;
          local_268 = 0x41a00000;
          Processor::init((Processor *)&stack0xfffffffffffffdb8,in_stack_fffffffffffffd30);
          Processor::getClusterings(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
          pvVar2 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::operator[]
                             ((vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *)
                              &stack0xfffffffffffffd60,0);
          if ((double)waveformMax_00 < pvVar2->pClusters) {
            pvVar2 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::operator[]
                               ((vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *)
                                &stack0xfffffffffffffd60,0);
            waveformMax_00 = (TWaveformT<short> *)pvVar2->pClusters;
            fVar5 = in_XMM0_Da;
          }
          dVar3 = (double)in_XMM0_Da;
          pvVar2 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::operator[]
                             ((vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *)
                              &stack0xfffffffffffffd60,0);
          printf("    [findBestCutoffFreq] freqCutoff_Hz = %g, pClusters = %g\n",dVar3,
                 pvVar2->pClusters);
          std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::~vector
                    ((vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *)
                     in_stack_fffffffffffffd30);
          TParameters::~TParameters((TParameters *)0x1bc446);
          Processor::~Processor(in_stack_fffffffffffffd20);
          TFreqMap::~TFreqMap((TFreqMap *)0x1bc460);
          bVar1 = false;
        }
        else {
          fprintf(_stderr,"%s:%d: calculateSimilartyMap() failed\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                  ,0x527);
          bVar1 = true;
          local_4 = fVar6;
        }
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::~vector((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   *)in_stack_fffffffffffffd30);
      }
      stKeyPressCollection<short>::~stKeyPressCollection((stKeyPressCollection<short> *)0x1bc485);
    }
    else {
      fprintf(_stderr,"%s:%d: convert() failed\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
              ,0x516);
      bVar1 = true;
      local_4 = fVar6;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd30);
    std::vector<short,_std::allocator<short>_>::~vector
              ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffd30);
    if (bVar1) break;
    in_XMM0_Da = in_XMM2_Da + in_XMM0_Da;
  }
  return local_4;
}

Assistant:

float findBestCutoffFreq(const TWaveformF & waveform, EAudioFilter filterId, int64_t sampleRate, float minCutoffFreq_Hz, float maxCutoffFreq_Hz, float step_Hz) {
        double pClustersBest = -1e10;
        float freqCutoffBest_Hz = minCutoffFreq_Hz;

        for (float freqCutoff_Hz = minCutoffFreq_Hz; freqCutoff_Hz <= maxCutoffFreq_Hz; freqCutoff_Hz += step_Hz) {
            TWaveformI16 waveformInput;
            TWaveformF waveformFiltered = waveform;
            filter(waveformFiltered, (EAudioFilter) filterId, freqCutoff_Hz, sampleRate);

            if (convert(waveformFiltered, waveformInput) == false) {
                fprintf(stderr, "%s:%d: convert() failed\n", __FILE__, __LINE__);
                return minCutoffFreq_Hz;
            }

            TKeyPressCollectionI16 keyPresses;
            {
                TWaveformI16 waveformMax;
                TWaveformI16 waveformThreshold;
                if (findKeyPresses(getView(waveformInput, 0), keyPresses, waveformThreshold, waveformMax,
                                   kFindKeysThreshold, kFindKeysHistorySize, kFindKeysHistorySizeReset, kFindKeysRemoveLowPower) == false) {
                    fprintf(stderr, "%s:%d: findKeyPresses() failed\n", __FILE__, __LINE__);
                    return minCutoffFreq_Hz;
                }
            }

            TSimilarityMap similarityMap;
            if (calculateSimilartyMap(kKeyWidth_samples, kKeyAlign_samples, kKeyWidth_samples - kKeyOffset_samples, keyPresses, similarityMap) == false) {
                fprintf(stderr, "%s:%d: calculateSimilartyMap() failed\n", __FILE__, __LINE__);
                return minCutoffFreq_Hz;
            }

            {
                Cipher::TFreqMap freqMap; // not used for anything
                Cipher::Processor processor;

                Cipher::TParameters params;
                params.maxClusters = 50;
                params.wEnglishFreq = 20.0;
                processor.init(params, freqMap, similarityMap);

                auto clusteringsCur = processor.getClusterings(1);
                if (clusteringsCur[0].pClusters > pClustersBest) {
                    pClustersBest = clusteringsCur[0].pClusters;
                    freqCutoffBest_Hz = freqCutoff_Hz;
                }
                printf("    [findBestCutoffFreq] freqCutoff_Hz = %g, pClusters = %g\n", freqCutoff_Hz, clusteringsCur[0].pClusters);
            }
        }

        return freqCutoffBest_Hz;
    }